

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.cpp
# Opt level: O1

void run_kd_tree<std::array<float,128ul>,float>
               (vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *train,
               vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *test,
               string *fn_nns_gt,max_leaf_size_t tree_max_leaf_size,
               vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
               *nns)

{
  pointer *__s;
  node *pnVar1;
  node_type *node;
  char cVar2;
  ostream *poVar3;
  pointer pnVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  scoped_timer t1;
  kd_tree<std::reference_wrapper<const_std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  kd_tree;
  max_leaf_size_t local_6e8;
  search_nn<pico_tree::neighbor<int,_float>_> local_6e0;
  scoped_timer local_6d8;
  undefined1 local_6a8 [16];
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> local_698 [22];
  search_nn<pico_tree::neighbor<int,_float>_> *local_488;
  undefined1 local_480 [16];
  undefined1 local_470 [1048];
  _func_int **local_58;
  node *local_50;
  node_type *local_38;
  
  local_6e8.value = tree_max_leaf_size.value;
  pico_tree::std::
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>::resize
            (nns,(long)(test->
                       super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(test->
                       super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 9);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_480,fn_nns_gt,auto_format);
  cVar2 = std::filesystem::status((path *)local_480);
  pico_tree::std::filesystem::__cxx11::path::~path((path *)local_480);
  if ((cVar2 == -1) || (cVar2 == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Creating ",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(fn_nns_gt->_M_dataplus)._M_p,
                        fn_nns_gt->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," using the kd_tree. Be *very* patient.",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_6a8._8_8_ = &local_6e8;
    local_6a8._0_8_ = train;
    run_kd_tree<std::array<float,_128UL>,_float>::anon_class_16_2_5d62e1b5::operator()
              ((kd_tree<std::reference_wrapper<const_std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
                *)local_480,(anon_class_16_2_5d62e1b5 *)local_6a8);
    local_6a8._0_8_ = local_698;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"kd_tree query","");
    local_6d8.name_._M_dataplus._M_p = (pointer)&local_6d8.name_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6d8,local_6a8._0_8_,
               (long)&(((_Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                         *)local_6a8._0_8_)->_M_impl).super__Vector_impl_data._M_start +
               (long)(size_t *)local_6a8._8_8_);
    local_6d8.start_.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_6d8.times_ = 1;
    if ((vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *)
        local_6a8._0_8_ != local_698) {
      operator_delete((void *)local_6a8._0_8_,
                      (ulong)((long)(local_698[0].
                                     super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 1));
    }
    pnVar4 = (nns->
             super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((nns->
        super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pnVar4) {
      __s = &local_698[0].
             super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar7 = 0;
      lVar5 = 0;
      uVar6 = 0;
      do {
        local_698[0].
        super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)((test->
                              super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5);
        local_6e0.nn_ = (neighbor_type *)((long)&pnVar4->index + lVar7);
        pnVar4[uVar6].distance = 3.4028235e+38;
        local_6a8._0_8_ = local_480._0_8_;
        local_698[0].
        super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_470;
        memset(__s,0,0x200);
        node = local_38;
        local_488 = &local_6e0;
        memset(__s,0,0x200);
        pico_tree::internal::
        search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<std::array<float,_128UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
        ::search_nearest((search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<std::array<float,_128UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                          *)local_6a8,node,0.0);
        uVar6 = uVar6 + 1;
        pnVar4 = (nns->
                 super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x200;
        lVar7 = lVar7 + 8;
      } while (uVar6 < (ulong)((long)(nns->
                                     super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar4 >> 3
                              ));
    }
    pico_tree::scoped_timer::~scoped_timer(&local_6d8);
    pico_tree::write_bin<pico_tree::neighbor<int,float>>(fn_nns_gt,nns);
    local_58 = (_func_int **)&PTR__list_pool_resource_00111d50;
    while (local_50 != (node *)0x0) {
      pnVar1 = local_50->prev;
      operator_delete(local_50,0x2008);
      local_50 = pnVar1;
    }
    if ((void *)local_470._0_8_ != (void *)0x0) {
      operator_delete((void *)local_470._0_8_,local_470._16_8_ - local_470._0_8_);
    }
  }
  else {
    pico_tree::read_bin<pico_tree::neighbor<int,float>>(fn_nns_gt,nns);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"kd_tree not created. Read ",0x1a);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(fn_nns_gt->_M_dataplus)._M_p,
                        fn_nns_gt->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," instead.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void run_kd_tree(
    std::vector<Vector_> const& train,
    std::vector<Vector_> const& test,
    std::string const& fn_nns_gt,
    pico_tree::max_leaf_size_t tree_max_leaf_size,
    std::vector<pico_tree::neighbor<int, Scalar_>>& nns) {
  using space = std::reference_wrapper<std::vector<Vector_> const>;

  nns.resize(test.size());

  if (!std::filesystem::exists(fn_nns_gt)) {
    std::cout << "Creating " << fn_nns_gt
              << " using the kd_tree. Be *very* patient." << std::endl;

    auto kd_tree = [&train, &tree_max_leaf_size]() {
      pico_tree::scoped_timer t0("kd_tree build");
      return pico_tree::kd_tree<space>(train, tree_max_leaf_size);
    }();

    {
      pico_tree::scoped_timer t1("kd_tree query");
      for (std::size_t i = 0; i < nns.size(); ++i) {
        kd_tree.search_nn(test[i], nns[i]);
      }
    }

    pico_tree::write_bin(fn_nns_gt, nns);
  } else {
    pico_tree::read_bin(fn_nns_gt, nns);
    std::cout << "kd_tree not created. Read " << fn_nns_gt << " instead."
              << std::endl;
  }
}